

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * __thiscall
pbrt::Image::GaussianFilter
          (Image *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,int halfWidth,
          Float sigma)

{
  int iVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  Image *pIVar3;
  pointer pbVar4;
  iterator __begin1;
  Allocator AVar5;
  pointer pfVar6;
  long lVar7;
  Float FVar8;
  float fVar9;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  int nc;
  int halfWidth_local;
  Image *local_158;
  Float local_14c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<float,_std::allocator<float>_> wts;
  _Any_data local_118;
  code *pcStack_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *pcStack_e8;
  code *pcStack_e0;
  ColorEncodingHandle local_d8;
  ColorEncodingHandle local_d0;
  Image blurx;
  
  blurx.format = U256;
  halfWidth_local = halfWidth;
  local_158 = __return_storage_ptr__;
  local_14c = sigma;
  std::vector<float,_std::allocator<float>_>::vector
            (&wts,(long)(halfWidth * 2 + 1),(value_type *)&blurx,(allocator_type *)&local_148);
  for (lVar7 = 0; lVar7 <= halfWidth * 2; lVar7 = lVar7 + 1) {
    FVar8 = Gaussian((float)((int)lVar7 - halfWidth),0.0,local_14c);
    wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = FVar8;
  }
  fVar9 = 0.0;
  for (pfVar6 = wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar6 != wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar6 = pfVar6 + 1) {
    fVar9 = fVar9 + *pfVar6;
  }
  for (; wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
           = wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start + 1) {
    *wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = *wts.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start / fVar9;
  }
  TVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  ChannelNames_abi_cxx11_(&local_148,this,desc);
  pbVar4 = local_148.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d0.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  lVar7 = (long)local_148.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_148.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  AVar5.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = lVar7 >> 5;
  channels.ptr = pbVar4;
  Image(&blurx,Float,(Point2i)TVar2,channels,&local_d0,AVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  nc = (int)(desc->offset).nStored;
  iVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  pcStack_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = operator_new(0x30);
  *(Image **)local_f8._M_unused._0_8_ = this;
  *(ImageChannelDesc **)((long)local_f8._M_unused._0_8_ + 8) = desc;
  *(int **)((long)local_f8._M_unused._0_8_ + 0x10) = &halfWidth_local;
  *(int **)((long)local_f8._M_unused._0_8_ + 0x18) = &nc;
  *(vector<float,_std::allocator<float>_> **)((long)local_f8._M_unused._0_8_ + 0x20) = &wts;
  *(Image **)((long)local_f8._M_unused._0_8_ + 0x28) = &blurx;
  pcStack_e0 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:211:34)>
               ::_M_invoke;
  pcStack_e8 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:211:34)>
               ::_M_manager;
  ParallelFor(0,(long)iVar1,(function<void_(long,_long)> *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  TVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  ChannelNames_abi_cxx11_(&local_148,this,desc);
  local_d8.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar5.memoryResource = pstd::pmr::new_delete_resource();
  channels_00.n =
       (long)local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  channels_00.ptr =
       local_148.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  Image(local_158,Float,(Point2i)TVar2,channels_00,&local_d8,AVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  iVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  pcStack_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x38);
  pIVar3 = local_158;
  *(Image **)local_118._M_unused._0_8_ = this;
  *(ImageChannelDesc **)((long)local_118._M_unused._0_8_ + 8) = desc;
  *(int **)((long)local_118._M_unused._0_8_ + 0x10) = &halfWidth_local;
  *(Image **)((long)local_118._M_unused._0_8_ + 0x18) = &blurx;
  *(int **)((long)local_118._M_unused._0_8_ + 0x20) = &nc;
  *(vector<float,_std::allocator<float>_> **)((long)local_118._M_unused._0_8_ + 0x28) = &wts;
  pcStack_100 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:228:34)>
                ::_M_invoke;
  pcStack_108 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:228:34)>
                ::_M_manager;
  *(Image **)((long)local_118._M_unused._0_8_ + 0x30) = local_158;
  ParallelFor(0,(long)iVar1,(function<void_(long,_long)> *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  ~Image(&blurx);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&wts.super__Vector_base<float,_std::allocator<float>_>);
  return pIVar3;
}

Assistant:

Image Image::GaussianFilter(const ImageChannelDesc &desc, int halfWidth,
                            Float sigma) const {
    // Compute filter weights
    std::vector<Float> wts(2 * halfWidth + 1, Float(0));
    for (int d = 0; d < 2 * halfWidth + 1; ++d)
        wts[d] = Gaussian(d - halfWidth, 0, sigma);

    // Normalize weights
    Float wtSum = std::accumulate(wts.begin(), wts.end(), Float(0));
    for (Float &w : wts)
        w /= wtSum;

    // Separable blur; first blur in x into blurx, selecting out the
    // desired channels along the way.
    Image blurx(PixelFormat::Float, resolution, ChannelNames(desc));
    int nc = desc.size();
    ParallelFor(0, resolution.y, [&](int64_t y0, int64_t y1) {
        for (int y = y0; y < y1; ++y) {
            for (int x = 0; x < resolution.x; ++x) {
                ImageChannelValues result(desc.size());
                for (int r = -halfWidth; r <= halfWidth; ++r) {
                    ImageChannelValues cv = GetChannels({x + r, y}, desc);
                    for (int c = 0; c < nc; ++c)
                        result[c] += wts[r + halfWidth] * cv[c];
                }
                blurx.SetChannels({x, y}, result);
            }
        }
    });

    // Now blur in y from blur x to the result; blurx has just the
    // channels we want already.
    Image blury(PixelFormat::Float, resolution, ChannelNames(desc));
    ParallelFor(0, resolution.y, [&](int64_t y0, int64_t y1) {
        for (int y = y0; y < y1; ++y) {
            for (int x = 0; x < resolution.x; ++x) {
                ImageChannelValues result(desc.size());
                for (int r = -halfWidth; r <= halfWidth; ++r) {
                    ImageChannelValues cv = blurx.GetChannels({x, y + r});
                    for (int c = 0; c < nc; ++c)
                        result[c] += wts[r + halfWidth] * cv[c];
                }
                blury.SetChannels({x, y}, result);
            }
        }
    });
    return blury;
}